

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

double nonius::detail::
       standard_deviation<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                 (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> first,
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last)

{
  anon_class_8_1_54a3980d __binary_op;
  double dVar1;
  
  __binary_op.m =
       mean<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                 (first,last);
  dVar1 = std::
          accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double,nonius::detail::standard_deviation<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>(__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>)::_lambda(double,double)_1_>
                    (first,last,0.0,__binary_op);
  return SQRT(dVar1 / (double)((long)last._M_current - (long)first._M_current >> 3));
}

Assistant:

double standard_deviation(Iterator first, Iterator last) {
            auto m = mean(first, last);
            double variance = std::accumulate(first, last, 0., [m](double a, double b) {
                        double diff = b - m;
                        return a + diff*diff;
                    }) / (last - first);
            return std::sqrt(variance);
        }